

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O2

void arbitrary_json_notification(json *value)

{
  string sStack_28;
  
  nlohmann::
  to_string<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (&sStack_28,value);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void arbitrary_json_notification(const json& value) {
  to_string(value);
}